

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O2

void weather_update(void)

{
  AREA_DATA *pAVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  size_t __n;
  uint uVar6;
  ushort uVar7;
  char *__src;
  int iVar8;
  uint uVar9;
  AREA_DATA_conflict **ppAVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  char buf [4608];
  
  lVar3 = (long)time_info.season;
  ppAVar10 = &area_first;
  while (ppAVar10 = &((AREA_DATA_conflict *)ppAVar10)->next->next,
        (AREA_DATA_conflict *)ppAVar10 != (AREA_DATA_conflict *)0x0) {
    iVar2 = number_percent();
    for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
      if (iVar2 <= *(short *)((long)((AREA_DATA_conflict *)ppAVar10)->climate * 0x78 +
                              lVar3 * 0x12 + 0x4ea8ca + lVar5 * 2)) {
        ((AREA_DATA_conflict *)ppAVar10)->sky = (short)lVar5;
        break;
      }
    }
    iVar2 = number_percent();
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      if (iVar2 <= *(short *)((long)((AREA_DATA_conflict *)ppAVar10)->climate * 0x78 +
                              lVar3 * 8 + 0x4ea912 + lVar5 * 2)) {
        ((AREA_DATA_conflict *)ppAVar10)->temp = (short)lVar5;
        break;
      }
    }
    iVar2 = number_range(0,2);
    ((AREA_DATA_conflict *)ppAVar10)->wind = (short)iVar2;
  }
  ppAVar10 = &area_first;
  while (ppAVar10 = &((AREA_DATA_conflict *)ppAVar10)->next->next,
        (AREA_DATA_conflict *)ppAVar10 != (AREA_DATA_conflict *)0x0) {
    iVar2 = 0;
    iVar4 = 0;
    for (lVar3 = 0; lVar3 != 0x19; lVar3 = lVar3 + 1) {
      pAVar1 = ((AREA_DATA_conflict *)ppAVar10)->adjacent[lVar3];
      if (pAVar1 == (AREA_DATA *)0x0) {
        if (lVar3 != 0) goto LAB_003197ef;
        uVar7 = ((AREA_DATA_conflict *)ppAVar10)->sky;
        goto LAB_00319857;
      }
      iVar2 = iVar2 + pAVar1->sky;
      iVar4 = iVar4 + pAVar1->temp;
    }
    lVar3 = 0x19;
LAB_003197ef:
    iVar8 = (int)lVar3 + 1;
    iVar2 = iVar2 / iVar8;
    uVar7 = ((AREA_DATA_conflict *)ppAVar10)->sky;
    uVar9 = iVar2 - (short)uVar7;
    uVar6 = -uVar9;
    if (0 < (int)uVar9) {
      uVar6 = uVar9;
    }
    if (3 < uVar6) {
      uVar7 = (ushort)((iVar2 + (short)uVar7) / 2);
      ((AREA_DATA_conflict *)ppAVar10)->sky = uVar7;
    }
    iVar4 = iVar4 / iVar8;
    uVar9 = iVar4 - ((AREA_DATA_conflict *)ppAVar10)->temp;
    uVar6 = -uVar9;
    if (0 < (int)uVar9) {
      uVar6 = uVar9;
    }
    if (1 < uVar6) {
      ((AREA_DATA_conflict *)ppAVar10)->temp = (short)((iVar4 + (short)uVar7) / 2);
    }
LAB_00319857:
    if ((5 < (short)uVar7) && (((AREA_DATA_conflict *)ppAVar10)->temp < 2)) {
      ((AREA_DATA_conflict *)ppAVar10)->temp = 2;
    }
    if ((uVar7 < 8) && ((0xb0U >> (uVar7 & 0x1f) & 1) != 0)) {
      ((AREA_DATA_conflict *)ppAVar10)->wind = ((AREA_DATA_conflict *)ppAVar10)->wind + 1;
    }
    if (((AREA_DATA_conflict *)ppAVar10)->climate == 0) {
      ((AREA_DATA_conflict *)ppAVar10)->sky = 1;
      ((AREA_DATA_conflict *)ppAVar10)->temp = 1;
      ((AREA_DATA_conflict *)ppAVar10)->wind = 0;
    }
  }
  ppAVar10 = &area_first;
  do {
    ppAVar10 = &((AREA_DATA_conflict *)ppAVar10)->next->next;
    if ((AREA_DATA_conflict *)ppAVar10 == (AREA_DATA_conflict *)0x0) {
      return;
    }
    switch(((AREA_DATA_conflict *)ppAVar10)->sky) {
    case 0:
      builtin_strncpy(buf,"There is not a cloud to be seen in the sky above.",0x32);
      break;
    case 1:
      builtin_strncpy(buf,"A few clouds dot the skies above.",0x22);
      break;
    case 2:
      builtin_strncpy(buf + 0x10,"s of clouds obscures the sky.",0x1e);
      uVar11._0_1_ = 'A';
      uVar11._1_1_ = ' ';
      uVar11._2_1_ = 't';
      uVar11._3_1_ = 'h';
      uVar12._0_1_ = 'i';
      uVar12._1_1_ = 'c';
      uVar12._2_1_ = 'k';
      uVar12._3_1_ = ' ';
      uVar13._0_1_ = 'g';
      uVar13._1_1_ = 'r';
      uVar13._2_1_ = 'e';
      uVar13._3_1_ = 'y';
      uVar14._0_1_ = ' ';
      uVar14._1_1_ = 'm';
      uVar14._2_1_ = 'a';
      uVar14._3_1_ = 's';
      goto LAB_00319965;
    case 3:
      builtin_strncpy(buf,"A light drizzle falls from the sky.",0x24);
      break;
    case 4:
      builtin_strncpy(buf + 0x10,"our down from the skies above.",0x1f);
      uVar11._0_1_ = 'S';
      uVar11._1_1_ = 'h';
      uVar11._2_1_ = 'e';
      uVar11._3_1_ = 'e';
      uVar12._0_1_ = 't';
      uVar12._1_1_ = 's';
      uVar12._2_1_ = ' ';
      uVar12._3_1_ = 'o';
      uVar13._0_1_ = 'f';
      uVar13._1_1_ = ' ';
      uVar13._2_1_ = 'r';
      uVar13._3_1_ = 'a';
      uVar14._0_1_ = 'i';
      uVar14._1_1_ = 'n';
      uVar14._2_1_ = ' ';
      uVar14._3_1_ = 'p';
LAB_00319965:
      buf[4] = (char)uVar12;
      buf[5] = SUB41(uVar12,1);
      buf[6] = SUB41(uVar12,2);
      buf[7] = SUB41(uVar12,3);
      buf[0] = (char)uVar11;
      buf[1] = SUB41(uVar11,1);
      buf[2] = SUB41(uVar11,2);
      buf[3] = SUB41(uVar11,3);
      buf[0xc] = (char)uVar14;
      buf[0xd] = SUB41(uVar14,1);
      buf[0xe] = SUB41(uVar14,2);
      buf[0xf] = SUB41(uVar14,3);
      buf[8] = (char)uVar13;
      buf[9] = SUB41(uVar13,1);
      buf[10] = SUB41(uVar13,2);
      buf[0xb] = SUB41(uVar13,3);
      break;
    case 5:
      __src = "Lightning flashes in the distance as a booming peal of thunder approaches.";
      __n = 0x4b;
      goto LAB_003199ca;
    case 6:
      builtin_strncpy(buf,"Scattered snowflakes drift down from the skies above.",0x36);
      break;
    case 7:
      __src = "Driving snow sweeps down from the skies as a chill fills the air.";
      __n = 0x42;
LAB_003199ca:
      memcpy(buf,__src,__n);
      break;
    case 8:
      builtin_strncpy(buf,"Pebble-sized hailstones begin to fall from the skies.",0x36);
      break;
    default:
      buf._0_8_ = buf._0_8_ & 0xffffffffffffff00;
    }
    outdoors_echo((AREA_DATA_conflict *)ppAVar10,buf);
  } while( true );
}

Assistant:

void weather_update(void)
{
	char buf[MSL];
	int i, random, season = time_info.season;
	int average = 0, skytot = 0, temptot = 0;
	AREA_DATA *area;

	/* Randomize sky, temperature, wind for each area, based on climate */
	for (area = area_first; area; area = area->next)
	{
		random = number_percent();

		for (i = 0; i < WeatherCondition::MaxWeatherCondition; i++)
		{
			if (random <= climate_table[area->climate].skyfreqs[season][i])
			{
				area->sky = i;
				break;
			}
		}

		random = number_percent();

		for (i = 0; i < Temperature::MaxTemperature; i++)
		{
			if (random <= climate_table[area->climate].tempfreqs[season][i])
			{
				area->temp = i;
				break;
			}
		}

		area->wind = number_range(0, 2);
	}

	/* Adjacent areas have a moderating influence on weather.  If there's
	 * a blizzard going on next door, it won't be perfectly sunny.  Similarly,
	 * it won't be hot and snowing at the same time, etc.  Just make sure that
	 * illogical combinations are eliminated. */
	for (area = area_first; area; area = area->next)
	{
		skytot = 0;
		temptot = 0;

		for (i = 0; i < MAX_ADJACENT; i++)
		{
			if (!area->adjacent[i])
				break;

			skytot += area->adjacent[i]->sky;
			temptot += area->adjacent[i]->temp;
		}

		if (i > 0)
		{
			average = skytot / (i + 1);

			if (abs(average - area->sky) >= 4)
				area->sky = (area->sky + average) / 2;

			average = temptot / (i + 1);

			if (abs(average - area->temp) >= 2)
				area->temp = (area->sky + average) / 2;
		}

		if (area->sky >= WeatherCondition::SnowFlurry && area->temp < Temperature::Cool)
			area->temp = Temperature::Cool;

		if (area->sky == WeatherCondition::Downpour
				 || area->sky == WeatherCondition::ThunderStorm
				 || area->sky == WeatherCondition::Blizzard)
			area->wind++;

		if (area->climate == Climate::None)
		{
			area->sky = WeatherCondition::PartlyCloudy;
			area->temp = Temperature::Warm;
			area->wind = Windspeed::Calm;
		}
	}

	/* Echo the changing weather to everyone who's outdoors. */
	for (area = area_first; area; area = area->next)
	{
		switch (area->sky)
		{
			case WeatherCondition::Clear:
				sprintf(buf, "There is not a cloud to be seen in the sky above.");
				break;
			case WeatherCondition::PartlyCloudy:
				sprintf(buf, "A few clouds dot the skies above.");
				break;
			case WeatherCondition::Overcast:
				sprintf(buf, "A thick grey mass of clouds obscures the sky.");
				break;
			case WeatherCondition::Drizzle:
				sprintf(buf, "A light drizzle falls from the sky.");
				break;
			case WeatherCondition::Downpour:
				sprintf(buf, "Sheets of rain pour down from the skies above.");
				break;
			case WeatherCondition::ThunderStorm:
				sprintf(buf, "Lightning flashes in the distance as a booming peal of thunder approaches.");
				break;
			case WeatherCondition::SnowFlurry:
				sprintf(buf, "Scattered snowflakes drift down from the skies above.");
				break;
			case WeatherCondition::Blizzard:
				sprintf(buf, "Driving snow sweeps down from the skies as a chill fills the air.");
				break;
			case WeatherCondition::Hail:
				sprintf(buf, "Pebble-sized hailstones begin to fall from the skies.");
				break;
			default:
				buf[0] = '\0';
				break;
		}

		outdoors_echo(area, buf);
	}
}